

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_gamma_file3.hpp
# Opt level: O2

void __thiscall
packed_gamma_file3<unsigned_int,_6UL>::fill_bits(packed_gamma_file3<unsigned_int,_6UL> *this)

{
  undefined8 in_RAX;
  uint uVar1;
  undefined8 uStack_38;
  uint8_t x;
  
  uStack_38 = in_RAX;
  while (((&this->field_0xb0)[*(long *)(*(long *)&this->in + -0x18)] & 2) == 0) {
    std::istream::read((char *)&this->in,(long)&x);
    for (uVar1 = 7; uVar1 != 0xffffffff; uVar1 = uVar1 - 1) {
      std::vector<bool,_std::allocator<bool>_>::push_back
                (&this->bits,(x >> (uVar1 & 0x1f) & 1) != 0);
    }
  }
  return;
}

Assistant:

void fill_bits(){

		//first of all, delete from bits all bits that have already been read

		assert(idx_in_bits==0);

		while(not in.eof()){

			uint8_t x;
			in.read((char*)&x,1);

			//push back bits of x in vector bits
			for(int j=0;j<8;++j) bits.push_back( (x>>(7-j)) & uint8_t(1) );

		}

	}